

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O1

void __thiscall
ctemplate::JsonEscape::Modify
          (JsonEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte bVar1;
  long lVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar7 = in;
  if (0 < (long)inlen) {
    pcVar6 = in;
LAB_0012be62:
    pcVar7 = pcVar6;
    lVar5 = 0;
    do {
      bVar1 = pcVar7[lVar5];
      if (bVar1 < 0x22) {
        switch(bVar1) {
        case 8:
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 2;
          pcVar6 = "\\b";
          goto LAB_0012c0c8;
        case 9:
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 2;
          pcVar6 = "\\t";
          goto LAB_0012c0c8;
        case 10:
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 2;
          pcVar6 = "\\n";
          goto LAB_0012c0c8;
        case 0xc:
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 2;
          pcVar6 = "\\f";
          goto LAB_0012c0c8;
        case 0xd:
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 2;
          pcVar6 = "\\r";
          goto LAB_0012c0c8;
        }
      }
      else if (bVar1 < 0x3c) {
        if (bVar1 == 0x22) {
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 2;
          pcVar6 = "\\\"";
          goto LAB_0012c0c8;
        }
        if (bVar1 == 0x26) {
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 6;
          pcVar6 = "\\u0026";
          goto LAB_0012c0c8;
        }
        if (bVar1 == 0x2f) goto LAB_0012c046;
      }
      else {
        if (bVar1 == 0x3c) {
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 6;
          pcVar6 = "\\u003C";
          goto LAB_0012c0c8;
        }
        if (bVar1 == 0x3e) {
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 6;
          pcVar6 = "\\u003E";
          goto LAB_0012c0c8;
        }
        if (bVar1 == 0x5c) {
          if (pcVar7 < pcVar7 + lVar5) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 2;
          pcVar6 = "\\\\";
          goto LAB_0012c0c8;
        }
      }
      lVar2 = lVar5 + 1;
      lVar5 = lVar5 + 1;
      if (in + inlen <= pcVar7 + lVar2) {
        in = pcVar7 + lVar5;
        break;
      }
    } while( true );
  }
LAB_0012c0f1:
  if (pcVar7 < in) {
    (*out->_vptr_ExpandEmitter[5])(out,pcVar7,(long)in - (long)pcVar7);
    return;
  }
  return;
LAB_0012c046:
  if (pcVar7 < pcVar7 + lVar5) {
    (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar5);
  }
  pp_Var3 = out->_vptr_ExpandEmitter;
  uVar4 = 2;
  pcVar6 = "\\/";
LAB_0012c0c8:
  (*pp_Var3[5])(out,pcVar6,uVar4);
  pcVar6 = pcVar7 + lVar5 + 1;
  if (in + inlen <= pcVar7 + lVar5 + 1) goto code_r0x0012c0db;
  goto LAB_0012be62;
code_r0x0012c0db:
  in = pcVar7 + lVar5 + 1;
  pcVar7 = in;
  goto LAB_0012c0f1;
}

Assistant:

void JsonEscape::Modify(const char* in, size_t inlen,
                        const PerExpandData*,
                        ExpandEmitter* out, const string& arg) const {
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit) {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      case '"':  EmitRun(start, pos, out); APPEND("\\\"");    break;
      case '\\': EmitRun(start, pos, out); APPEND("\\\\");    break;
      case '/':  EmitRun(start, pos, out); APPEND("\\/");     break;
      case '\b': EmitRun(start, pos, out); APPEND("\\b");     break;
      case '\f': EmitRun(start, pos, out); APPEND("\\f");     break;
      case '\n': EmitRun(start, pos, out); APPEND("\\n");     break;
      case '\r': EmitRun(start, pos, out); APPEND("\\r");     break;
      case '\t': EmitRun(start, pos, out); APPEND("\\t");     break;
      case '&':  EmitRun(start, pos, out); APPEND("\\u0026"); break;
      case '<':  EmitRun(start, pos, out); APPEND("\\u003C"); break;
      case '>':  EmitRun(start, pos, out); APPEND("\\u003E"); break;
    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
}